

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Gia_RsbMan_t *
Gia_RsbAlloc(Gia_Man_t *pGia,word *pOffSet,word *pOnSet,Vec_Wrd_t *vSims,int nWords,
            Vec_Wrd_t *vSimsT,int nWordsT,Vec_Int_t *vCands)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *p;
  Vec_Wec_t *pVVar3;
  Gia_RsbMan_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Wec_t *pVVar7;
  word *pwVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  size_t __nmemb;
  uint uVar14;
  
  pGVar4 = (Gia_RsbMan_t *)calloc(1,0x78);
  if (0x400 < nWords) {
    __assert_fail("nWords <= 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x563,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  uVar12 = nWords * 0x40;
  if (vSims->nSize != uVar12 * nWordsT) {
    __assert_fail("Vec_WrdSize(vSims) == 64 * nWords * nWordsT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x564,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  if (vSims->nSize != vSimsT->nSize) {
    __assert_fail("Vec_WrdSize(vSims) == Vec_WrdSize(vSimsT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x565,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  pGVar4->pGia = pGia;
  pGVar4->pOffSet = pOffSet;
  pGVar4->pOnSet = pOnSet;
  pGVar4->nWords = nWords;
  pGVar4->nWordsT = nWordsT;
  pGVar4->vSims = vSims;
  pGVar4->vSimsT = vSimsT;
  pGVar4->vCands = vCands;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  pGVar4->vObjs = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  pGVar4->vObjs2 = pVVar5;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  pVVar7->nCap = 0x400;
  pVVar7->nSize = 0;
  pVVar5 = (Vec_Int_t *)calloc(0x400,0x10);
  pVVar7->pArray = pVVar5;
  pGVar4->vSets[0] = pVVar7;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  pVVar7->nCap = 0x400;
  pVVar7->nSize = 0;
  pVVar5 = (Vec_Int_t *)calloc(0x400,0x10);
  pVVar7->pArray = pVVar5;
  pGVar4->vSets[1] = pVVar7;
  __nmemb = (size_t)nWordsT;
  pwVar8 = (word *)calloc(__nmemb,8);
  pGVar4->pSet[0] = pwVar8;
  pwVar8 = (word *)calloc(__nmemb,8);
  pGVar4->pSet[1] = pwVar8;
  pwVar8 = (word *)calloc(__nmemb,8);
  pGVar4->pSet[2] = pwVar8;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  pGVar4->vActive = pVVar5;
  iVar1 = vCands->nSize;
  if (0 < (long)iVar1) {
    piVar6 = vCands->pArray;
    lVar13 = 0;
    do {
      iVar2 = piVar6[lVar13];
      if (nWordsT * 0x40 <= iVar2) {
        __assert_fail("iObj < nWordsT * 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x578,
                      "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                     );
      }
      pGVar4->pSet[0][iVar2 >> 6] = pGVar4->pSet[0][iVar2 >> 6] | 1L << ((byte)iVar2 & 0x3f);
      lVar13 = lVar13 + 1;
    } while (iVar1 != lVar13);
  }
  pVVar7 = pGVar4->vSets[0];
  Vec_WecPushLevel(pVVar7);
  p = pGVar4->vSets[1];
  Vec_WecPushLevel(p);
  if (0 < nWords) {
    uVar14 = 1;
    if (1 < (int)uVar12) {
      uVar14 = uVar12;
    }
    uVar11 = 0;
    do {
      uVar9 = pOffSet[uVar11 >> 6] >> ((byte)uVar11 & 0x3f);
      uVar10 = 1L << ((byte)uVar11 & 0x3f) & pOnSet[uVar11 >> 6];
      if (((pOffSet[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) || (uVar10 != 0)) {
        if (((uVar9 & 1) == 0) && (uVar10 != 0)) {
          if (p->nSize < 1) {
            if (p->nCap < 1) {
              if (p->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc(0x10);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(p->pArray,0x10);
              }
              p->pArray = pVVar5;
              memset(pVVar5 + p->nCap,0,(1 - (long)p->nCap) * 0x10);
              p->nCap = 1;
            }
            p->nSize = 1;
          }
          iVar1 = p->nSize;
          pVVar3 = p;
          goto joined_r0x007cd470;
        }
        if (((uVar9 & 1) != 0) && (uVar10 != 0)) {
          __assert_fail("!Value0 || !Value1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                        ,0x585,
                        "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                       );
        }
      }
      else {
        if (pVVar7->nSize < 1) {
          if (pVVar7->nCap < 1) {
            if (pVVar7->pArray == (Vec_Int_t *)0x0) {
              pVVar5 = (Vec_Int_t *)malloc(0x10);
            }
            else {
              pVVar5 = (Vec_Int_t *)realloc(pVVar7->pArray,0x10);
            }
            pVVar7->pArray = pVVar5;
            memset(pVVar5 + pVVar7->nCap,0,(1 - (long)pVVar7->nCap) * 0x10);
            pVVar7->nCap = 1;
          }
          pVVar7->nSize = 1;
        }
        iVar1 = pVVar7->nSize;
        pVVar3 = pVVar7;
joined_r0x007cd470:
        if (iVar1 < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        Vec_IntPush(pVVar3->pArray,(int)uVar11);
      }
      uVar12 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar12;
    } while (uVar14 != uVar12);
  }
  if (pVVar7->nSize != 1) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x587,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  if (p->nSize == 1) {
    Abc_Random(1);
    return pGVar4;
  }
  __assert_fail("Vec_WecSize(p->vSets[1]) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x588,
                "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
               );
}

Assistant:

Gia_RsbMan_t * Gia_RsbAlloc( Gia_Man_t * pGia, word * pOffSet, word * pOnSet, Vec_Wrd_t * vSims, int nWords, Vec_Wrd_t * vSimsT, int nWordsT, Vec_Int_t * vCands )
{
    int i, iObj;
    Gia_RsbMan_t * p = ABC_CALLOC( Gia_RsbMan_t, 1 );
    assert( nWords <= 1024 );
    assert( Vec_WrdSize(vSims) == 64 * nWords * nWordsT );
    assert( Vec_WrdSize(vSims) == Vec_WrdSize(vSimsT) );
    p->pGia      = pGia;
    p->pOffSet   = pOffSet;
    p->pOnSet    = pOnSet;
    p->nWords    = nWords;
    p->nWordsT   = nWordsT;
    p->vSims     = vSims;
    p->vSimsT    = vSimsT;
    p->vCands    = vCands;
    p->vObjs     = Vec_IntAlloc( 100 );
    p->vObjs2    = Vec_IntAlloc( 100 );
    p->vSets[0]  = Vec_WecAlloc( 1024 );
    p->vSets[1]  = Vec_WecAlloc( 1024 );
    p->pSet[0]   = ABC_CALLOC( word, nWordsT );
    p->pSet[1]   = ABC_CALLOC( word, nWordsT );
    p->pSet[2]   = ABC_CALLOC( word, nWordsT );
    p->vActive   = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vCands, iObj, i )
    {
        assert( iObj < nWordsT * 64 );
        Abc_TtSetBit( p->pSet[0], iObj );
    }
    Vec_WecPushLevel( p->vSets[0] );
    Vec_WecPushLevel( p->vSets[1] );
    for ( i = 0; i < 64*nWords; i++ )
    {
        int Value0 = Abc_TtGetBit( pOffSet, i );
        int Value1 = Abc_TtGetBit( pOnSet,  i );
        if ( Value0 && !Value1 )
            Vec_WecPush( p->vSets[0], 0, i );
        else if ( !Value0 && Value1 )
            Vec_WecPush( p->vSets[1], 0, i );
        else assert( !Value0 || !Value1 );
    }
    assert( Vec_WecSize(p->vSets[0]) == 1 );
    assert( Vec_WecSize(p->vSets[1]) == 1 );
    Abc_Random( 1 );
    //Extra_PrintBinary2( stdout, (unsigned*)pOffSet, 64*nWords ); printf( "\n" );
    //Extra_PrintBinary2( stdout, (unsigned*)pOnSet,  64*nWords ); printf( "\n" );
    return p;
}